

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void Test_TemplateModifiers_AddXssSafeModifier::Run(void)

{
  char cVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  string *psStack_b0;
  string *psStack_a8;
  undefined1 auStack_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  undefined1 auStack_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  undefined1 auStack_60 [16];
  undefined1 *apuStack_50 [2];
  undefined1 auStack_40 [16];
  
  cVar1 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar1 == '\0') {
    Run();
LAB_00114fb4:
    Run();
LAB_00114fb9:
    Run();
LAB_00114fbe:
    Run();
LAB_00114fc3:
    Run();
LAB_00114fc8:
    Run();
LAB_00114fcd:
    Run();
LAB_00114fd2:
    Run();
LAB_00114fd7:
    Run();
LAB_00114fdc:
    Run();
LAB_00114fe1:
    Run();
LAB_00114fe6:
    Run();
LAB_00114feb:
    Run();
LAB_00114ff0:
    Run();
LAB_00114ff5:
    Run();
  }
  else {
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114fb4;
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114fb9;
    cVar1 = ctemplate::AddXssSafeModifier("test",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114fbe;
    cVar1 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape)
    ;
    if (cVar1 != '\0') goto LAB_00114fc3;
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114fc8;
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114fcd;
    cVar1 = ctemplate::AddModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114fd2;
    cVar1 = ctemplate::AddModifier("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114fd7;
    cVar1 = ctemplate::AddModifier("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114fdc;
    cVar1 = ctemplate::AddXssSafeModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape)
    ;
    if (cVar1 != '\0') goto LAB_00114fe1;
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114fe6;
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114feb;
    cVar1 = ctemplate::AddModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114ff0;
    cVar1 = ctemplate::AddModifier("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114ff5;
    cVar1 = ctemplate::AddModifier("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') {
      return;
    }
  }
  Run();
  aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
  psStack_b0 = (string *)auStack_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
  apuStack_50[0] = auStack_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"h","");
  aStack_70._M_allocated_capacity = (size_type)auStack_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
  bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                              psStack_b0,psStack_a8);
  if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
    operator_delete((void *)aStack_70._M_allocated_capacity);
  }
  if (apuStack_50[0] != auStack_40) {
    operator_delete(apuStack_50[0]);
  }
  if (psStack_b0 != (string *)auStack_a0) {
    operator_delete(psStack_b0);
  }
  if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
    operator_delete((void *)aStack_90._M_allocated_capacity);
  }
  if (bVar2) {
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_a0 + 0x10),"url_escape_with_arg","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=javascript","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"url_escape_with_arg","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=javascript","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011690a;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"x-bla","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"x-bla","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011690f;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"H","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=pre","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"p","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116914;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_a0 + 0x10),"url_query_escape","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"url_escape_with_arg","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=query","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116919;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=pre","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011691e;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=snippet","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116923;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=attribute","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116928;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=url","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011692d;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"p","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116932;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"u","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116937;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"U","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=query","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011693c;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"U","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=html","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116941;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"I","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=html","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116946;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"H","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=attribute","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"h","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_0011694b;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"I","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=html","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"h","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_00116950;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"h","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"json_escape","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_00116955;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"H","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=pre","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=snippet","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011695a;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"H","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=pre","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=attribute","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011695f;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"H","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=attribute","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"H","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=pre","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_00116964;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"json_escape","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"javascript_escape","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116969;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_a0 + 0x10),"javascript_escape","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"json_escape","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011696e;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_a0 + 0x10),"javascript_escape","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"I","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=javascript","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116973;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"U","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=javascript","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"I","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=javascript","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116978;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"I","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=javascript","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"javascript_escape","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_0011697d;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"I","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=javascript","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"U","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=javascript","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_00116982;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"c","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"U","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=css","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_00116987;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"c","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"I","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"=css","");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) goto LAB_0011698c;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"U","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=css","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"c","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (bVar2) goto LAB_00116991;
    aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"I","");
    psStack_b0 = (string *)auStack_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"=css","");
    apuStack_50[0] = auStack_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"c","");
    aStack_70._M_allocated_capacity = (size_type)auStack_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
    bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,(string *)aStack_90._8_8_,
                                psStack_b0,psStack_a8);
    if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
      operator_delete((void *)aStack_70._M_allocated_capacity);
    }
    if (apuStack_50[0] != auStack_40) {
      operator_delete(apuStack_50[0]);
    }
    if (psStack_b0 != (string *)auStack_a0) {
      operator_delete(psStack_b0);
    }
    if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
      operator_delete((void *)aStack_90._M_allocated_capacity);
    }
    if (!bVar2) {
      aStack_90._M_allocated_capacity = (size_type)(string *)auStack_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_a0 + 0x10),"x-bla","");
      psStack_b0 = (string *)auStack_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_b0,"");
      apuStack_50[0] = auStack_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_50,"x-foo","");
      aStack_70._M_allocated_capacity = (size_type)auStack_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_80 + 0x10),"");
      bVar2 = CheckXSSAlternative((string *)aStack_90._M_allocated_capacity,
                                  (string *)aStack_90._8_8_,psStack_b0,psStack_a8);
      if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
        operator_delete((void *)aStack_70._M_allocated_capacity);
      }
      if (apuStack_50[0] != auStack_40) {
        operator_delete(apuStack_50[0]);
      }
      if (psStack_b0 != (string *)auStack_a0) {
        operator_delete(psStack_b0);
      }
      if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
        operator_delete((void *)aStack_90._M_allocated_capacity);
      }
      if (!bVar2) {
        return;
      }
      goto LAB_0011699b;
    }
  }
  else {
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011690a:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011690f:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116914:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116919:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011691e:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116923:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116928:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011692d:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116932:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116937:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011693c:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116941:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116946:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011694b:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116950:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116955:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011695a:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011695f:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116964:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116969:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011696e:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116973:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116978:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011697d:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116982:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116987:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011698c:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116991:
    Test_TemplateModifiers_XSSAlternatives::Run();
  }
  Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011699b:
  Test_TemplateModifiers_XSSAlternatives::Run();
  if ((undefined1 *)aStack_70._M_allocated_capacity != auStack_60) {
    operator_delete((void *)aStack_70._M_allocated_capacity);
  }
  if (apuStack_50[0] != auStack_40) {
    operator_delete(apuStack_50[0]);
  }
  if (psStack_b0 != (string *)auStack_a0) {
    operator_delete(psStack_b0);
  }
  if ((string *)aStack_90._M_allocated_capacity != (string *)auStack_80) {
    operator_delete((void *)aStack_90._M_allocated_capacity);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateModifiers, AddXssSafeModifier) {
  // For shorter lines.
  const GOOGLE_NAMESPACE::TemplateModifier* esc_fn =
      &GOOGLE_NAMESPACE::html_escape;

  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h", esc_fn));

  // Make sure AddXssSafeModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("test", esc_fn));

  // Make sure AddXssSafeModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h",
                                             esc_fn));

  // Make sure AddXssSafeModifier fails if the same modifier was
  // previously added via AddModifier.
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=h", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=h", esc_fn));

  // and vice versa.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=h", esc_fn));
}